

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-writer.cc
# Opt level: O2

bool tinyusdz::usda::SaveAsUSDA(string *filename,Stage *stage,string *warn,string *err)

{
  bool bVar1;
  ostream *poVar2;
  string s;
  string local_40;
  
  Stage::ExportToString_abi_cxx11_(&local_40,stage,false);
  bVar1 = io::WriteWholeFile(filename,(uchar *)local_40._M_dataplus._M_p,local_40._M_string_length,
                             err);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Wrote to [");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    std::operator<<(poVar2,"]\n");
  }
  std::__cxx11::string::_M_dispose();
  return bVar1;
}

Assistant:

bool SaveAsUSDA(const std::string &filename, const Stage &stage,
                std::string *warn, std::string *err) {

  (void)warn;

  // TODO: Handle warn and err on export.
  std::string s = stage.ExportToString();

  if (!io::WriteWholeFile(filename, reinterpret_cast<const unsigned char *>(s.data()), s.size(), err)) {
    return false;
  }

  std::cout << "Wrote to [" << filename << "]\n";

  return true;
}